

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpInit2(char *IfName,unsigned_short DestPort)

{
  char *local_20;
  int local_18;
  int retVal;
  unsigned_short DestPort_local;
  char *IfName_local;
  
  ithread_initialize_library();
  pthread_mutex_lock((pthread_mutex_t *)&gSDKInitMutex);
  if (UpnpSdkInit == 1) {
    local_18 = -0x69;
  }
  else {
    UpnpSdkInit = 1;
    local_18 = UpnpInitPreamble();
    if (local_18 == 0) {
      local_20 = IfName;
      if (IfName == (char *)0x0) {
        local_20 = "NULL";
      }
      UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x237,
                 "UpnpInit2 with IfName=%s, DestPort=%d.\n",local_20,(uint)DestPort);
      local_18 = UpnpGetIfInfo(IfName);
      if (local_18 == 0) {
        local_18 = UpnpInitStartServers(DestPort);
      }
    }
  }
  if ((local_18 != 0) && (local_18 != -0x69)) {
    UpnpFinish();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&gSDKInitMutex);
  return local_18;
}

Assistant:

int UpnpInit2(const char *IfName, unsigned short DestPort)
{
	int retVal;

	/* Initializes the ithread library */
	ithread_initialize_library();

	ithread_mutex_lock(&gSDKInitMutex);

	/* Check if we're already initialized. */
	if (UpnpSdkInit == 1) {
		retVal = UPNP_E_INIT;
		goto exit_function;
	}

	/* Set the UpnpSdkInit flag to 1 to indicate we're successfully
	 * initialized. */
	UpnpSdkInit = 1;

	/* Perform initialization preamble. */
	retVal = UpnpInitPreamble();
	if (retVal != UPNP_E_SUCCESS) {
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		API,
		__FILE__,
		__LINE__,
		"UpnpInit2 with IfName=%s, DestPort=%d.\n",
		IfName ? IfName : "NULL",
		DestPort);

	/* Retrieve interface information (Addresses, index, etc). */
	retVal = UpnpGetIfInfo(IfName);
	if (retVal != UPNP_E_SUCCESS) {
		goto exit_function;
	}

	/* Finish initializing the SDK. */
	retVal = UpnpInitStartServers(DestPort);
	if (retVal != UPNP_E_SUCCESS) {
		goto exit_function;
	}

exit_function:
	if (retVal != UPNP_E_SUCCESS && retVal != UPNP_E_INIT) {
		UpnpFinish();
	}
	ithread_mutex_unlock(&gSDKInitMutex);

	return retVal;
}